

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::processEvents(WindowImplX11 *this)

{
  int iVar1;
  long in_RDI;
  XEvent nextEvent;
  bool processThisEvent;
  XEvent event;
  int local_190 [14];
  ulong local_158;
  int local_13c;
  byte local_c9;
  int local_c8 [14];
  ulong local_90;
  int local_74;
  
  do {
    iVar1 = XCheckIfEvent(*(undefined8 *)(in_RDI + 0x3d0),local_c8,
                          anon_unknown.dwarf_43725f::WindowsImplX11Impl::checkEvent,
                          *(undefined8 *)(in_RDI + 0x3c8));
    if (iVar1 == 0) {
      ClipboardImpl::processEvents();
      return;
    }
    local_c9 = 1;
    while( true ) {
      if ((local_c8[0] != 3) ||
         (iVar1 = XCheckIfEvent(*(undefined8 *)(in_RDI + 0x3d0),local_190,
                                anon_unknown.dwarf_43725f::WindowsImplX11Impl::checkEvent,
                                *(undefined8 *)(in_RDI + 0x3c8)), iVar1 == 0)) goto LAB_0031a4d6;
      if ((local_190[0] == 2) &&
         (((local_13c == local_74 && (local_90 <= local_158)) && (local_158 <= local_90 + 1))))
      break;
      processEvent((WindowImplX11 *)event.pad[0xe],(XEvent *)event.pad[0xd]);
      memcpy(local_c8,local_190,0xc0);
    }
    if ((*(byte *)(in_RDI + 0x418) & 1) == 0) {
      local_c9 = 0;
    }
    else {
      memcpy(local_c8,local_190,0xc0);
    }
LAB_0031a4d6:
    if ((local_c9 & 1) != 0) {
      processEvent((WindowImplX11 *)event.pad[0xe],(XEvent *)event.pad[0xd]);
    }
  } while( true );
}

Assistant:

void WindowImplX11::processEvents()
{
    using namespace WindowsImplX11Impl;

    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
    {
        // This function implements a workaround to properly discard
        // repeated key events when necessary. The problem is that the
        // system's key events policy doesn't match SFML's one: X server will generate
        // both repeated KeyPress and KeyRelease events when maintaining a key down, while
        // SFML only wants repeated KeyPress events. Thus, we have to:
        // - Discard duplicated KeyRelease events when m_keyRepeat is true
        // - Discard both duplicated KeyPress and KeyRelease events when m_keyRepeat is false

        bool processThisEvent = true;

        // Detect repeated key events
        while (event.type == KeyRelease)
        {
            XEvent nextEvent;
            if (XCheckIfEvent(m_display, &nextEvent, checkEvent, reinterpret_cast<XPointer>(m_window)))
            {
                if ((nextEvent.type == KeyPress) && (nextEvent.xkey.keycode == event.xkey.keycode) &&
                    (event.xkey.time <= nextEvent.xkey.time) && (nextEvent.xkey.time <= event.xkey.time + 1))
                {
                    // This sequence of events comes from maintaining a key down
                    if (m_keyRepeat)
                    {
                        // Ignore the KeyRelease event and process the KeyPress event
                        event = nextEvent;
                        break;
                    }
                    else
                    {
                        // Ignore both events
                        processThisEvent = false;
                        break;
                    }
                }
                else
                {
                    // This sequence of events does not come from maintaining a key down,
                    // so process the KeyRelease event normally,
                    processEvent(event);
                    // but loop because the next event can be the first half
                    // of a sequence coming from maintaining a key down.
                    event = nextEvent;
                }
            }
            else
            {
                // No event after this KeyRelease event so assume it can be processed.
                break;
            }
        }

        if (processThisEvent)
        {
            processEvent(event);
        }
    }

    // Process clipboard window events
    priv::ClipboardImpl::processEvents();
}